

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall
ChainstateManager::ProcessNewBlock
          (ChainstateManager *this,shared_ptr<const_CBlock> *block,bool force_processing,
          bool min_pow_checked,bool *new_block)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  ValidationSignals *this_00;
  _Head_base<0UL,_Chainstate_*,_false> _Var5;
  bool bVar6;
  bool bVar7;
  Chainstate *pCVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Head_base<0UL,_Chainstate_*,_false> this_01;
  long in_FS_OFFSET;
  string_view source_file;
  shared_ptr<const_CBlock> pblock;
  string_view source_file_00;
  shared_ptr<const_CBlock> pblock_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  element_type *local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  element_type *local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  CBlockIndex *pindex;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock34;
  undefined1 local_d8 [16];
  BlockValidationState bg_state;
  BlockValidationState state;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pindex = (CBlockIndex *)0x0;
  if (new_block != (bool *)0x0) {
    *new_block = false;
  }
  paVar2 = &state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  criticalblock34.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock34.super_unique_lock._M_owns = false;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)paVar2;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock34.super_unique_lock);
  bVar6 = CheckBlock((block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     &state,&((this->m_options).chainparams)->consensus,true,true);
  if (bVar6) {
    bVar7 = AcceptBlock(this,block,&state,&pindex,force_processing,(FlatFilePos *)0x0,new_block,
                        min_pow_checked);
    bVar6 = true;
    if (bVar7) goto LAB_00ae4511;
  }
  this_00 = (this->m_options).signals;
  if (this_00 != (ValidationSignals *)0x0) {
    ValidationSignals::BlockChecked
              (this_00,(block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               &state);
  }
  ValidationState<BlockValidationResult>::ToString_abi_cxx11_
            ((string *)&bg_state,&state.super_ValidationState<BlockValidationResult>);
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
  ;
  source_file._M_len = 0x5e;
  logging_function._M_str = "ProcessNewBlock";
  logging_function._M_len = 0xf;
  LogPrintFormatInternal<char[16],std::__cxx11::string>
            (logging_function,source_file,0x11d3,ALL,Error,(ConstevalFormatString<2U>)0xfb28a2,
             (char (*) [16])"ProcessNewBlock",(string *)&bg_state);
  if ((size_type *)bg_state.super_ValidationState<BlockValidationResult>._0_8_ !=
      &bg_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length) {
    operator_delete((void *)bg_state.super_ValidationState<BlockValidationResult>._0_8_,
                    bg_state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                    _M_string_length + 1);
  }
  bVar6 = false;
LAB_00ae4511:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock34.super_unique_lock);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p !=
      &state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2) {
    operator_delete(state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus.
                    _M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.m_debug_message
                                  .field_2._M_allocated_capacity._1_7_,
                                  state.super_ValidationState<BlockValidationResult>.m_debug_message
                                  .field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p !=
      paVar2) {
    operator_delete(state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus.
                    _M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.m_reject_reason
                                  .field_2._M_allocated_capacity._1_7_,
                                  state.super_ValidationState<BlockValidationResult>.m_reject_reason
                                  .field_2._M_local_buf[0]) + 1);
  }
  if (bVar6) {
    NotifyHeaderTip(this);
    state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] =
         '\0';
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
         '\0';
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)paVar2;
    pCVar8 = ActiveChainstate(this);
    local_100 = (block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    _Var9._M_pi = (block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                  _M_pi;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var9._M_pi)->_M_use_count = (_Var9._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var9._M_pi)->_M_use_count = (_Var9._M_pi)->_M_use_count + 1;
      }
    }
    pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var9._M_pi;
    pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_100;
    local_f8 = _Var9._M_pi;
    bVar6 = Chainstate::ActivateBestChain(pCVar8,&state,pblock);
    if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
    }
    if (bVar6) {
      bg_state.super_ValidationState<BlockValidationResult>._0_8_ = &cs_main;
      bg_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
           bg_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
           0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&bg_state);
      pCVar8 = (this->m_snapshot_chainstate)._M_t.
               super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
               super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
      if (((pCVar8 == (Chainstate *)0x0) || (pCVar8->m_disabled != false)) ||
         (_Var5._M_head_impl =
               (this->m_ibd_chainstate)._M_t.
               super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
               super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
         _Var5._M_head_impl == (Chainstate *)0x0)) {
        this_01._M_head_impl = (Chainstate *)0x0;
      }
      else {
        this_01._M_head_impl = (Chainstate *)0x0;
        if ((_Var5._M_head_impl)->m_disabled == false) {
          this_01._M_head_impl = _Var5._M_head_impl;
        }
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&bg_state);
      bg_state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
      bg_state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
      paVar1 = &bg_state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
      bg_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
      bg_state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0]
           = '\0';
      paVar3 = &bg_state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
      bg_state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
      bg_state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0]
           = '\0';
      bVar6 = true;
      bg_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)paVar1;
      bg_state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
           (pointer)paVar3;
      if (this_01._M_head_impl != (Chainstate *)0x0) {
        local_110 = (block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_108 = (block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
        if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_108->_M_use_count = local_108->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_108->_M_use_count = local_108->_M_use_count + 1;
          }
        }
        pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Var9._M_pi;
        pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_110;
        bVar7 = Chainstate::ActivateBestChain(this_01._M_head_impl,&bg_state,pblock_00);
        if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
        }
        if (!bVar7) {
          ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                    ((string *)&criticalblock34,
                     &bg_state.super_ValidationState<BlockValidationResult>);
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_01._M_len = 0x5e;
          logging_function_01._M_str = "ProcessNewBlock";
          logging_function_01._M_len = 0xf;
          LogPrintFormatInternal<char[16],std::__cxx11::string>
                    (logging_function_01,source_file_01,0x11e3,ALL,Error,
                     (ConstevalFormatString<2U>)0xfb28e2,(char (*) [16])"ProcessNewBlock",
                     (string *)&criticalblock34);
          if (criticalblock34.super_unique_lock._M_device != (mutex_type *)local_d8) {
            operator_delete(criticalblock34.super_unique_lock._M_device,local_d8._0_8_ + 1);
          }
          bVar6 = false;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)bg_state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p
          != paVar3) {
        operator_delete(bg_state.super_ValidationState<BlockValidationResult>.m_debug_message.
                        _M_dataplus._M_p,
                        CONCAT71(bg_state.super_ValidationState<BlockValidationResult>.
                                 m_debug_message.field_2._M_allocated_capacity._1_7_,
                                 bg_state.super_ValidationState<BlockValidationResult>.
                                 m_debug_message.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)bg_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p
          != paVar1) {
        operator_delete(bg_state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_dataplus._M_p,
                        CONCAT71(bg_state.super_ValidationState<BlockValidationResult>.
                                 m_reject_reason.field_2._M_allocated_capacity._1_7_,
                                 bg_state.super_ValidationState<BlockValidationResult>.
                                 m_reject_reason.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                ((string *)&bg_state,&state.super_ValidationState<BlockValidationResult>);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_00._M_len = 0x5e;
      logging_function_00._M_str = "ProcessNewBlock";
      logging_function_00._M_len = 0xf;
      LogPrintFormatInternal<char[16],std::__cxx11::string>
                (logging_function_00,source_file_00,0x11dc,ALL,Error,
                 (ConstevalFormatString<2U>)0xfb28bf,(char (*) [16])"ProcessNewBlock",
                 (string *)&bg_state);
      if ((size_type *)bg_state.super_ValidationState<BlockValidationResult>._0_8_ !=
          &bg_state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length) {
        operator_delete((void *)bg_state.super_ValidationState<BlockValidationResult>._0_8_,
                        bg_state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length + 1);
      }
      bVar6 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p !=
        &state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2) {
      operator_delete(state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus
                      ._M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_allocated_capacity._1_7_,
                                     state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p !=
        paVar2) {
      operator_delete(state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus
                      ._M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.
                                     m_reject_reason.field_2._M_allocated_capacity._1_7_,
                                     state.super_ValidationState<BlockValidationResult>.
                                     m_reject_reason.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    bVar6 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool ChainstateManager::ProcessNewBlock(const std::shared_ptr<const CBlock>& block, bool force_processing, bool min_pow_checked, bool* new_block)
{
    AssertLockNotHeld(cs_main);

    {
        CBlockIndex *pindex = nullptr;
        if (new_block) *new_block = false;
        BlockValidationState state;

        // CheckBlock() does not support multi-threaded block validation because CBlock::fChecked can cause data race.
        // Therefore, the following critical section must include the CheckBlock() call as well.
        LOCK(cs_main);

        // Skipping AcceptBlock() for CheckBlock() failures means that we will never mark a block as invalid if
        // CheckBlock() fails.  This is protective against consensus failure if there are any unknown forms of block
        // malleability that cause CheckBlock() to fail; see e.g. CVE-2012-2459 and
        // https://lists.linuxfoundation.org/pipermail/bitcoin-dev/2019-February/016697.html.  Because CheckBlock() is
        // not very expensive, the anti-DoS benefits of caching failure (of a definitely-invalid block) are not substantial.
        bool ret = CheckBlock(*block, state, GetConsensus());
        if (ret) {
            // Store to disk
            ret = AcceptBlock(block, state, &pindex, force_processing, nullptr, new_block, min_pow_checked);
        }
        if (!ret) {
            if (m_options.signals) {
                m_options.signals->BlockChecked(*block, state);
            }
            LogError("%s: AcceptBlock FAILED (%s)\n", __func__, state.ToString());
            return false;
        }
    }

    NotifyHeaderTip();

    BlockValidationState state; // Only used to report errors, not invalidity - ignore it
    if (!ActiveChainstate().ActivateBestChain(state, block)) {
        LogError("%s: ActivateBestChain failed (%s)\n", __func__, state.ToString());
        return false;
    }

    Chainstate* bg_chain{WITH_LOCK(cs_main, return BackgroundSyncInProgress() ? m_ibd_chainstate.get() : nullptr)};
    BlockValidationState bg_state;
    if (bg_chain && !bg_chain->ActivateBestChain(bg_state, block)) {
        LogError("%s: [background] ActivateBestChain failed (%s)\n", __func__, bg_state.ToString());
        return false;
     }

    return true;
}